

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

LArYieldResult * __thiscall
NEST::LArNEST::GetNRYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double density)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar5 = (this->fNR).alpha;
  dVar2 = pow(energy,(this->fNR).beta);
  dVar4 = (this->fNR).gamma;
  dVar3 = pow(efield,(this->fNR).delta);
  auVar9._0_8_ = dVar3 * dVar4;
  dVar4 = (this->fNR).epsilon + energy;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  auVar9._8_8_ = dVar4;
  dVar5 = dVar5 * dVar2;
  auVar9 = divpd(_DAT_001179e0,auVar9);
  dVar3 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  dVar4 = (this->fNR).alpha;
  dVar6 = pow(energy,(this->fNR).beta);
  dVar2 = (this->fNR).gamma;
  dVar7 = pow(efield,(this->fNR).delta);
  dVar8 = (this->fNR).epsilon + energy;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  auVar10._8_8_ = dVar8;
  auVar10._0_8_ = dVar7 * dVar2;
  auVar10 = divpd(_DAT_001188c0,auVar10);
  dVar2 = this->fNexOverNion;
  dVar7 = this->fWorkQuantaFunction;
  __return_storage_ptr__->TotalYield = dVar5;
  auVar1._8_8_ = (1.0 - 1.0 / (dVar3 + 1.0)) * auVar9._8_8_ * auVar9._0_8_;
  auVar1._0_8_ = dVar4 * dVar6 + auVar10._8_8_ * auVar10._0_8_;
  auVar9 = maxpd(ZEXT816(0),auVar1);
  dVar3 = energy * auVar9._0_8_;
  dVar6 = energy * auVar9._8_8_;
  dVar4 = dVar6 + dVar3;
  dVar2 = dVar4 / (dVar2 + 1.0);
  __return_storage_ptr__->QuantaYield = auVar9._8_8_;
  __return_storage_ptr__->LightYield = auVar9._0_8_;
  __return_storage_ptr__->Nph = dVar3;
  __return_storage_ptr__->Ne = dVar6;
  __return_storage_ptr__->Nex = dVar4 - dVar2;
  __return_storage_ptr__->Nion = dVar2;
  __return_storage_ptr__->Lindhard = (dVar5 / energy) * dVar7 * 0.001;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetNRYields(double energy, double efield,
                                    double density) {
  double NRTotalYields = GetNRTotalYields(energy);
  double NRElectronYields = GetNRElectronYields(energy, efield);
  if (NRElectronYields < 0.0) {
    NRElectronYields = 0.0;
  }
  double NRPhotonYields = GetNRPhotonYields(energy, efield);
  if (NRPhotonYields < 0.0) {
    NRPhotonYields = 0.0;
  }
  return GetRecombinationYields(NRTotalYields, NRElectronYields, NRPhotonYields,
                                energy, efield);
}